

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Battle.cpp
# Opt level: O3

void __thiscall Battle::enemyTurn(Battle *this)

{
  bool turnAgain;
  int y;
  int x;
  bool local_29;
  int local_28;
  int local_24;
  
  local_24 = 1;
  local_28 = 1;
  local_29 = true;
  do {
    Player::areaNavigate(this->enemy,&local_24,&local_28);
    Player::attack(this->enemy,this->player,local_24,local_28,&local_29);
  } while (local_29 != false);
  return;
}

Assistant:

void Battle::enemyTurn() {
    int x = 1,y = 1;
    bool turnAgain = true;
    do {
        enemy->areaNavigate(x,y);
        enemy->attack(*player,x,y,turnAgain);
    } while (turnAgain);

}